

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_font_atlas_clear(nk_font_atlas *atlas)

{
  nk_font_config *pnVar1;
  nk_font *pnVar2;
  nk_plugin_free p_Var3;
  nk_font *pnVar4;
  nk_font_config *pnVar5;
  nk_font_config *pnVar6;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3647,"void nk_font_atlas_clear(struct nk_font_atlas *)");
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3648,"void nk_font_atlas_clear(struct nk_font_atlas *)");
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3649,"void nk_font_atlas_clear(struct nk_font_atlas *)");
  }
  if ((atlas->permanent).alloc != (nk_plugin_alloc)0x0) {
    if ((atlas->permanent).free != (nk_plugin_free)0x0) {
      pnVar5 = atlas->config;
      if (atlas->config != (nk_font_config *)0x0) {
        while (pnVar5 != (nk_font_config *)0x0) {
          pnVar6 = pnVar5->n;
          while (pnVar6 != pnVar5) {
            pnVar1 = pnVar6->n;
            p_Var3 = (atlas->permanent).free;
            if (pnVar6->ttf_blob != (void *)0x0) {
              (*p_Var3)((atlas->permanent).userdata,pnVar6->ttf_blob);
              p_Var3 = (atlas->permanent).free;
            }
            (*p_Var3)((atlas->permanent).userdata,pnVar6);
            pnVar6 = pnVar1;
          }
          pnVar1 = pnVar5->next;
          p_Var3 = (atlas->permanent).free;
          if (pnVar6->ttf_blob != (void *)0x0) {
            (*p_Var3)((atlas->permanent).userdata,pnVar5->ttf_blob);
            p_Var3 = (atlas->permanent).free;
          }
          (*p_Var3)((atlas->permanent).userdata,pnVar5);
          pnVar5 = pnVar1;
        }
        atlas->config = (nk_font_config *)0x0;
      }
      pnVar4 = atlas->fonts;
      if (atlas->fonts != (nk_font *)0x0) {
        while (pnVar4 != (nk_font *)0x0) {
          pnVar2 = pnVar4->next;
          (*(atlas->permanent).free)((atlas->permanent).userdata,pnVar4);
          pnVar4 = pnVar2;
        }
        atlas->fonts = (nk_font *)0x0;
      }
      if (atlas->glyphs != (nk_font_glyph *)0x0) {
        (*(atlas->permanent).free)((atlas->permanent).userdata,atlas->glyphs);
      }
      nk_zero(atlas,400);
      return;
    }
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x364b,"void nk_font_atlas_clear(struct nk_font_atlas *)");
  }
  __assert_fail("atlas->permanent.alloc",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x364a,"void nk_font_atlas_clear(struct nk_font_atlas *)");
}

Assistant:

NK_API void
nk_font_atlas_clear(struct nk_font_atlas *atlas)
{
    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);
    if (!atlas || !atlas->permanent.alloc || !atlas->permanent.free) return;

    if (atlas->config) {
        struct nk_font_config *iter, *next;
        for (iter = atlas->config; iter; iter = next) {
            struct nk_font_config *i, *n;
            for (i = iter->n; i != iter; i = n) {
                n = i->n;
                if (i->ttf_blob)
                    atlas->permanent.free(atlas->permanent.userdata, i->ttf_blob);
                atlas->permanent.free(atlas->permanent.userdata, i);
            }
            next = iter->next;
            if (i->ttf_blob)
                atlas->permanent.free(atlas->permanent.userdata, iter->ttf_blob);
            atlas->permanent.free(atlas->permanent.userdata, iter);
        }
        atlas->config = 0;
    }
    if (atlas->fonts) {
        struct nk_font *iter, *next;
        for (iter = atlas->fonts; iter; iter = next) {
            next = iter->next;
            atlas->permanent.free(atlas->permanent.userdata, iter);
        }
        atlas->fonts = 0;
    }
    if (atlas->glyphs)
        atlas->permanent.free(atlas->permanent.userdata, atlas->glyphs);
    nk_zero_struct(*atlas);
}